

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::InsertEdge
          (GraphCycles *this,GraphId idx,GraphId idy)

{
  Vec<int> *pVVar1;
  Vec<int> *pVVar2;
  int iVar3;
  uint32_t uVar4;
  int iVar5;
  Rep *r;
  Node **ppNVar6;
  Node *pNVar7;
  int *piVar8;
  int *piVar9;
  Vec<int> *src;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  uint uVar13;
  uint32_t i;
  ulong uVar14;
  long lVar15;
  Node *pNVar16;
  Node *pNVar17;
  int32_t w;
  uint local_64 [3];
  Vec<int> *local_58;
  Vec<int> *local_50;
  uint64_t local_48;
  NodeSet *local_40;
  NodeSet *local_38;
  
  r = this->rep_;
  ppNVar6 = (r->nodes_).ptr_;
  pNVar16 = ppNVar6[idx.handle & 0xffffffff];
  if (pNVar16->version != (uint32_t)(idx.handle >> 0x20)) {
    pNVar16 = (Node *)0x0;
  }
  uVar13 = (uint)idy.handle;
  pNVar7 = ppNVar6[idy.handle & 0xffffffff];
  pNVar17 = (Node *)0x0;
  if (pNVar7->version == (uint32_t)(idy.handle >> 0x20)) {
    pNVar17 = pNVar7;
  }
  bVar11 = true;
  if ((pNVar16 != (Node *)0x0) && (pNVar17 != (Node *)0x0)) {
    if (pNVar16 == pNVar17) {
LAB_00275b97:
      bVar11 = false;
    }
    else {
      local_38 = &pNVar16->out;
      bVar10 = anon_unknown_0::NodeSet::insert(local_38,uVar13);
      if (bVar10) {
        local_40 = &pNVar17->in;
        local_48 = idx.handle;
        anon_unknown_0::NodeSet::insert(local_40,(int32_t)idx.handle);
        iVar3 = pNVar16->rank;
        if (pNVar17->rank < iVar3) {
          local_50 = &r->deltaf_;
          local_64[0] = uVar13;
          anon_unknown_0::Vec<int>::clear(local_50);
          pVVar1 = &r->stack_;
          anon_unknown_0::Vec<int>::clear(pVVar1);
          local_58 = pVVar1;
          anon_unknown_0::Vec<int>::push_back(pVVar1,(int *)local_64);
          while (uVar4 = (r->stack_).size_, uVar4 != 0) {
            uVar12 = uVar4 - 1;
            local_64[0] = (r->stack_).ptr_[uVar12];
            (r->stack_).size_ = uVar12;
            pNVar16 = (r->nodes_).ptr_[local_64[0]];
            if (pNVar16->visited == false) {
              pNVar16->visited = true;
              anon_unknown_0::Vec<int>::push_back(local_50,(int *)local_64);
              local_64[1] = 0;
              while( true ) {
                bVar11 = anon_unknown_0::NodeSet::Next
                                   (&pNVar16->out,(int32_t *)(local_64 + 1),
                                    (int32_t *)(local_64 + 2));
                if (!bVar11) break;
                pNVar7 = (r->nodes_).ptr_[local_64[2]];
                iVar5 = pNVar7->rank;
                if (iVar5 == iVar3) {
                  anon_unknown_0::NodeSet::erase(local_38,uVar13);
                  anon_unknown_0::NodeSet::erase(local_40,(int32_t)local_48);
                  piVar8 = (r->deltaf_).ptr_;
                  uVar13 = (r->deltaf_).size_;
                  for (lVar15 = 0; (ulong)uVar13 << 2 != lVar15; lVar15 = lVar15 + 4) {
                    (r->nodes_).ptr_[*(uint *)((long)piVar8 + lVar15)]->visited = false;
                  }
                  goto LAB_00275b97;
                }
                if ((iVar5 < iVar3) && (pNVar7->visited == false)) {
                  anon_unknown_0::Vec<int>::push_back(local_58,(int *)(local_64 + 2));
                }
              }
            }
          }
          iVar3 = pNVar17->rank;
          local_64[0] = (uint)local_48;
          pVVar1 = &r->deltab_;
          anon_unknown_0::Vec<int>::clear(pVVar1);
          pVVar2 = local_58;
          anon_unknown_0::Vec<int>::clear(local_58);
          anon_unknown_0::Vec<int>::push_back(pVVar2,(int *)local_64);
          while (uVar4 = (r->stack_).size_, uVar4 != 0) {
            uVar13 = uVar4 - 1;
            local_64[0] = (r->stack_).ptr_[uVar13];
            (r->stack_).size_ = uVar13;
            pNVar16 = (r->nodes_).ptr_[local_64[0]];
            if (pNVar16->visited == false) {
              pNVar16->visited = true;
              anon_unknown_0::Vec<int>::push_back(pVVar1,(int *)local_64);
              local_64[1] = 0;
              while( true ) {
                bVar11 = anon_unknown_0::NodeSet::Next
                                   (&pNVar16->in,(int32_t *)(local_64 + 1),(int32_t *)(local_64 + 2)
                                   );
                if (!bVar11) break;
                pNVar7 = (r->nodes_).ptr_[local_64[2]];
                if ((pNVar7->visited == false) && (iVar3 < pNVar7->rank)) {
                  anon_unknown_0::Vec<int>::push_back(local_58,(int *)(local_64 + 2));
                }
              }
            }
          }
          Sort(&r->nodes_,pVVar1);
          src = local_50;
          Sort(&r->nodes_,local_50);
          pVVar2 = &r->list_;
          anon_unknown_0::Vec<int>::clear(pVVar2);
          MoveToList(r,pVVar1,pVVar2);
          MoveToList(r,src,pVVar2);
          anon_unknown_0::Vec<int>::resize(&r->merged_,(r->deltaf_).size_ + (r->deltab_).size_);
          piVar8 = (r->deltab_).ptr_;
          piVar9 = (r->deltaf_).ptr_;
          std::__merge<int*,int*,int*,__gnu_cxx::__ops::_Iter_less_iter>
                    (piVar8,piVar8 + (r->deltab_).size_,piVar9,piVar9 + (r->deltaf_).size_,
                     (r->merged_).ptr_);
          uVar13 = (r->list_).size_;
          bVar11 = true;
          for (uVar14 = 0; uVar13 != uVar14; uVar14 = uVar14 + 1) {
            (r->nodes_).ptr_[(uint)(r->list_).ptr_[uVar14]]->rank = (r->merged_).ptr_[uVar14];
          }
        }
      }
    }
  }
  return bVar11;
}

Assistant:

bool GraphCycles::InsertEdge(GraphId idx, GraphId idy) {
  Rep* r = rep_;
  const int32_t x = NodeIndex(idx);
  const int32_t y = NodeIndex(idy);
  Node* nx = FindNode(r, idx);
  Node* ny = FindNode(r, idy);
  if (nx == nullptr || ny == nullptr) return true;  // Expired ids

  if (nx == ny) return false;  // Self edge
  if (!nx->out.insert(y)) {
    // Edge already exists.
    return true;
  }

  ny->in.insert(x);

  if (nx->rank <= ny->rank) {
    // New edge is consistent with existing rank assignment.
    return true;
  }

  // Current rank assignments are incompatible with the new edge.  Recompute.
  // We only need to consider nodes that fall in the range [ny->rank,nx->rank].
  if (!ForwardDFS(r, y, nx->rank)) {
    // Found a cycle.  Undo the insertion and tell caller.
    nx->out.erase(y);
    ny->in.erase(x);
    // Since we do not call Reorder() on this path, clear any visited
    // markers left by ForwardDFS.
    for (const auto& d : r->deltaf_) {
      r->nodes_[static_cast<uint32_t>(d)]->visited = false;
    }
    return false;
  }
  BackwardDFS(r, x, ny->rank);
  Reorder(r);
  return true;
}